

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O2

int ssh2_rportfwd_cmp(void *av,void *bv)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(*(char **)((long)av + 8),*(char **)((long)bv + 8));
  if (iVar1 == 0) {
    if (*bv < *av) {
      uVar2 = 1;
    }
    else {
      uVar2 = -(uint)(*av < *bv);
    }
  }
  else {
    uVar2 = iVar1 >> 0x1f | 1;
  }
  return uVar2;
}

Assistant:

static int ssh2_rportfwd_cmp(void *av, void *bv)
{
    struct ssh_rportfwd *a = (struct ssh_rportfwd *) av;
    struct ssh_rportfwd *b = (struct ssh_rportfwd *) bv;
    int i;
    if ( (i = strcmp(a->shost, b->shost)) != 0)
        return i < 0 ? -1 : +1;
    if (a->sport > b->sport)
        return +1;
    if (a->sport < b->sport)
        return -1;
    return 0;
}